

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis_internal<long_double>
                 (size_t cnt,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  double dVar1;
  float fVar2;
  int cat;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  longdouble in_ST0;
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double local_e8;
  double local_e0;
  size_t ntry;
  
  uVar7 = cnt - buffer_cnt[ncat];
  local_e0 = -INFINITY;
  if (1 < uVar7) {
    fVar2 = (float)(&DAT_0036e0d8)[(long)uVar7 < 0];
    uVar8 = (ulong)(uint)ncat;
    if (ncat < 1) {
      if (cat_split_type != SubSet) {
        return -INFINITY;
      }
    }
    else {
      uVar6 = 0;
      do {
        buffer_prob[uVar6] =
             (double)(((float)(long)buffer_cnt[uVar6] +
                      (float)(&DAT_0036e0d8)[(long)buffer_cnt[uVar6] < 0]) /
                     ((float)(long)uVar7 + fVar2));
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      if (cat_split_type != SubSet) {
        if (ncat < 1) {
          return -INFINITY;
        }
        uVar7 = 0;
        dVar17 = 0.0;
        do {
          dVar1 = buffer_prob[uVar7];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar19 = dVar1 * dVar1;
            dVar17 = dVar17 + (dVar1 * dVar19 * dVar1 +
                              dVar1 * -4.0 * dVar1 * dVar19 +
                              dVar1 * 6.0 * dVar19 + dVar1 * -4.0 * dVar1 + dVar1) /
                              ((dVar1 - dVar19) * (dVar1 - dVar19));
          }
          else {
            ncat = ncat + -1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
        if (ncat < 2) {
          return -INFINITY;
        }
        if (0x7fefffffffffffff < (ulong)ABS(dVar17)) {
          return -INFINITY;
        }
        if (dVar17 <= 0.0) {
          dVar17 = 0.0;
        }
        return dVar17 / (double)ncat;
      }
    }
    uVar7 = rnd_generator->state[0];
    uVar6 = rnd_generator->state[1];
    uVar9 = rnd_generator->state[3];
    uVar5 = rnd_generator->state[2];
    local_e8 = 0.0;
    ntry = 0x32;
    lVar3 = 0;
    do {
      lVar12 = (longdouble)0;
      lVar13 = -(longdouble)0;
      lVar11 = lVar12;
      lVar14 = lVar12;
      if (0 < ncat) {
        uVar10 = 0;
        do {
          lVar14 = in_ST3;
          lVar13 = in_ST2;
          lVar12 = in_ST1;
          lVar11 = in_ST0;
          uVar4 = uVar6 << 0x11;
          uVar5 = uVar5 ^ uVar7;
          uVar9 = uVar9 ^ uVar6;
          uVar6 = uVar6 ^ uVar5;
          uVar7 = uVar7 ^ uVar9;
          uVar5 = uVar5 ^ uVar4;
          uVar9 = uVar9 << 0x2d | uVar9 >> 0x13;
          in_ST0 = lVar14;
          in_ST1 = lVar14;
          in_ST2 = lVar14;
          in_ST3 = lVar14;
          fmal();
          fmal();
          fmal();
          fmal();
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        rnd_generator->state[3] = uVar9;
        rnd_generator->state[1] = uVar6;
        rnd_generator->state[2] = uVar5;
        rnd_generator->state[0] = uVar7;
        lVar13 = lVar13 * (longdouble)-4.0;
      }
      lVar15 = lVar11 * lVar11;
      lVar16 = lVar12 - lVar15;
      if (lVar16 <= (longdouble)0) {
        ntry = ntry - 1;
      }
      else {
        local_e8 = (double)((lVar15 * lVar11 * lVar11 +
                            lVar11 * (longdouble)-4.0 * lVar15 * lVar11 +
                            lVar12 * (longdouble)6.0 * lVar15 + lVar13 * lVar11 + lVar14) /
                            (lVar16 * lVar16) + (longdouble)local_e8);
      }
      lVar3 = lVar3 + 1;
      in_ST1 = in_ST0;
      in_ST2 = in_ST0;
      in_ST3 = in_ST0;
    } while (lVar3 != 0x32);
    if ((ntry != 0) && ((ulong)ABS(local_e8) < 0x7ff0000000000000)) {
      auVar18._8_4_ = (int)(ntry >> 0x20);
      auVar18._0_8_ = ntry;
      auVar18._12_4_ = 0x45300000;
      if (local_e8 <= 0.0) {
        local_e8 = 0.0;
      }
      local_e0 = local_e8 /
                 ((auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)ntry) - 4503599627370496.0));
    }
  }
  return local_e0;
}

Assistant:

double calc_kurtosis_internal(size_t cnt, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                              MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    /* This calculation proceeds as follows:
        - If splitting by subsets, it will assign a random weight ~Unif(0,1) to
          each category, and approximate kurtosis by sampling from such distribution
          with the same probabilities as given by the current counts.
        - If splitting by isolating one category, will binarize at each categorical level,
          assume the values are zero or one, and output the average assuming each categorical
          level has equal probability of being picked.
        (Note that both are misleading heuristics, but might be better than random)
    */
    double sum_kurt = 0;

    cnt -= buffer_cnt[ncat];
    if (cnt <= 1) return -HUGE_VAL;
    ldouble_safe cnt_l = (ldouble_safe) cnt;
    for (int cat = 0; cat < ncat; cat++)
        buffer_prob[cat] = buffer_cnt[cat] / cnt_l;

    switch (cat_split_type)
    {
        case SubSet:
        {
            ldouble_safe temp_v;
            ldouble_safe s1, s2, s3, s4;
            ldouble_safe coef;
            ldouble_safe coef2;
            ldouble_safe w_this;
            UniformUnitInterval runif(0, 1);
            size_t ntry = 50;
            for (size_t iternum = 0; iternum < 50; iternum++)
            {
                s1 = 0; s2 = 0; s3 = 0; s4 = 0;
                for (int cat = 0; cat < ncat; cat++)
                {
                    coef = runif(rnd_generator);
                    coef2 = coef * coef;
                    w_this = buffer_prob[cat];
                    s1 = std::fma(w_this, coef, s1);
                    s2 = std::fma(w_this, coef2, s2);
                    s3 = std::fma(w_this, coef2*coef, s3);
                    s4 = std::fma(w_this, coef2*coef2, s4);
                    // s1 += buffer_prob[cat] * pw1(coef);
                    // s2 += buffer_prob[cat] * pw2(coef);
                    // s3 += buffer_prob[cat] * pw3(coef);
                    // s4 += buffer_prob[cat] * pw4(coef);
                }
                temp_v = s2 - pw2(s1);
                if (temp_v <= 0)
                    ntry--;
                else
                    sum_kurt += (s4 - 4 * s3 * pw1(s1) + 6 * s2 * pw2(s1) - 4 * s1 * pw3(s1) + pw4(s1)) / pw2(temp_v);
            }
            if (unlikely(!ntry))
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ntry;
        }

        case SingleCateg:
        {
            double p;
            int ncat_present = ncat;
            for (int cat = 0; cat < ncat; cat++)
            {
                p = buffer_prob[cat];
                if (p == 0)
                    ncat_present--;
                else
                    sum_kurt += (p - 4 * p * pw1(p) + 6 * p * pw2(p) - 4 * p * pw3(p) + pw4(p)) / pw2(p - pw2(p));
            }
            if (ncat_present <= 1)
                return -HUGE_VAL;
            else if (unlikely(is_na_or_inf(sum_kurt)))
                return -HUGE_VAL;
            else
                return std::fmax(sum_kurt, 0.) / (double)ncat_present;
        }
    }

    unreachable();
    return -1; /* this will never be reached, but CRAN complains otherwise */
}